

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  Index t;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference actions;
  reference observations;
  uint agentI;
  ulong __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aohI_vec;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivA_vec;
  Index this_agentAOHI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivO_vec;
  allocator_type local_8a;
  allocator_type local_89;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  value_type_conflict1 local_7c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  
  local_88 = __return_storage_ptr__;
  t = GetTimeStepForJAOHI(this,jaohI);
  iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
  local_60._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(ulong)t,
             (value_type_conflict1 *)&local_60,(allocator_type *)&local_7c);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_48,CONCAT44(extraout_var,iVar1),(value_type *)&local_78,&local_8a);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  local_7c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,(ulong)t,&local_7c,
             (allocator_type *)&local_8a);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&local_78,CONCAT44(extraout_var,iVar1),(value_type *)&local_60,&local_89);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  JointAOHIndexToIndividualActionObservationVectors
            (this,jaohI,&local_48,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_78);
  agentI = 0;
  (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_88->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    iVar1 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])(this);
    __n = (ulong)agentI;
    if (CONCAT44(extraout_var_00,iVar1) <= __n) break;
    actions = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&local_78,__n);
    observations = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::at(&local_48,__n);
    local_60._M_impl.super__Vector_impl_data._M_start._0_4_ =
         GetActionObservationHistoryIndex(this,agentI,t,actions,observations);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (local_88,(value_type_conflict1 *)&local_60);
    agentI = agentI + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_78);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  return local_88;
}

Assistant:

vector<Index> 
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndices(
        LIndex jaohI) const
{
    Index t = GetTimeStepForJAOHI(jaohI);
    //indivO_vec[agentI][t] = oI
    size_t nrAgents = GetNrAgents();
    vector< vector<Index> > indivO_vec(nrAgents, vector<Index>(t, 0));
    vector< vector<Index> > indivA_vec(nrAgents, vector<Index>(t, 0));
    JointAOHIndexToIndividualActionObservationVectors(
            jaohI, indivO_vec, indivA_vec );
    //calculate indiv observation history index from seq. of indiv. observations
    vector<Index> aohI_vec;
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
    {
        Index this_agentAOHI = GetActionObservationHistoryIndex(agentI, t, 
                            indivA_vec.at(agentI), indivO_vec.at(agentI) );
        aohI_vec.push_back(this_agentAOHI);
    }
    return(aohI_vec);
}